

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void cf_hmac_finish(cf_hmac_ctx *ctx,uint8_t *out)

{
  uint8_t local_58 [8];
  uint8_t innerh [64];
  uint8_t *out_local;
  cf_hmac_ctx *ctx_local;
  
  innerh._56_8_ = out;
  if ((ctx != (cf_hmac_ctx *)0x0) && (ctx->hash != (cf_chash *)0x0)) {
    if (out == (uint8_t *)0x0) {
      abort();
    }
    (*ctx->hash->digest)(&ctx->inner,local_58);
    (*ctx->hash->update)(&ctx->outer,local_58,ctx->hash->hashsz);
    (*ctx->hash->digest)(&ctx->outer,(uint8_t *)innerh._56_8_);
    mem_clean(ctx,0x2d8);
    return;
  }
  abort();
}

Assistant:

void cf_hmac_finish(cf_hmac_ctx *ctx, uint8_t *out)
{
  assert(ctx && ctx->hash);
  assert(out);

  uint8_t innerh[CF_MAXHASH];
  ctx->hash->digest(&ctx->inner, innerh);

  ctx->hash->update(&ctx->outer, innerh, ctx->hash->hashsz);
  ctx->hash->digest(&ctx->outer, out);

  mem_clean(ctx, sizeof *ctx);
}